

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O0

void __thiscall
t_xml_generator::write_element_number<double>(t_xml_generator *this,string *name,double n)

{
  string local_60;
  string local_40;
  double local_20;
  double n_local;
  string *name_local;
  t_xml_generator *this_local;
  
  local_20 = n;
  n_local = (double)name;
  name_local = (string *)this;
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  number_to_string<double>(&local_60,this,local_20);
  write_element_string(this,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void write_element_number(string name, T n) {
    write_element_string(name, number_to_string(n));
  }